

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int libssh2_userauth_publickey_fromfile_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,char *publickey,char *privatekey,
              char *passphrase)

{
  int iVar1;
  time_t start_time;
  char *passphrase_00;
  uchar *pubkeydata;
  size_t pubkeydata_len;
  size_t *local_68;
  uchar **local_60;
  char *local_58;
  char *local_50;
  privkey_file *local_48;
  privkey_file privkey_file;
  
  passphrase_00 = "";
  if (passphrase != (char *)0x0) {
    passphrase_00 = passphrase;
  }
  local_58 = publickey;
  local_50 = user;
  start_time = time((time_t *)0x0);
  local_60 = &session->userauth_pblc_method;
  local_68 = &session->userauth_pblc_method_len;
  do {
    pubkeydata = (uchar *)0x0;
    pubkeydata_len = 0;
    local_48 = &privkey_file;
    privkey_file.filename = privatekey;
    privkey_file.passphrase = passphrase_00;
    if (session->userauth_pblc_state == libssh2_NB_state_idle) {
      if (local_58 == (char *)0x0) {
        iVar1 = _libssh2_pub_priv_keyfile
                          (session,local_60,local_68,&pubkeydata,&pubkeydata_len,privatekey,
                           passphrase_00);
      }
      else {
        iVar1 = file_read_publickey(session,local_60,local_68,&pubkeydata,&pubkeydata_len,local_58);
      }
      if (iVar1 == 0) goto LAB_00129c6a;
    }
    else {
LAB_00129c6a:
      iVar1 = _libssh2_userauth_publickey
                        (session,local_50,(ulong)user_len,pubkeydata,pubkeydata_len,sign_fromfile,
                         &local_48);
      if (pubkeydata != (uchar *)0x0) {
        (*session->free)(pubkeydata,&session->abstract);
      }
    }
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_publickey_fromfile_ex(LIBSSH2_SESSION *session,
                                       const char *user,
                                       unsigned int user_len,
                                       const char *publickey,
                                       const char *privatekey,
                                       const char *passphrase)
{
    int rc;

    if(!passphrase)
        /* if given a NULL pointer, make it point to a zero-length
           string to save us from having to check this all over */
        passphrase = "";

    BLOCK_ADJUST(rc, session,
                 userauth_publickey_fromfile(session, user, user_len,
                                             publickey, privatekey,
                                             passphrase));
    return rc;
}